

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusmenuregistrarproxy_p.cpp
# Opt level: O1

void QDBusMenuRegistrarInterface::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int iVar1;
  QDBusPendingCall *pQVar2;
  QDBusError *this;
  undefined8 *puVar3;
  QDBusPendingReplyBase *this_00;
  long in_FS_OFFSET;
  QDBusPendingReply<QString,_QDBusObjectPath> _r;
  QDBusPendingReply<> _r_1;
  QDBusPendingReplyBase local_90;
  QDBusPendingReplyBase local_88;
  InterfaceType *pIStack_80;
  char16_t *local_78;
  undefined1 *puStack_70;
  QArrayData *local_68;
  char16_t *pcStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QArrayData *local_48;
  char16_t *pcStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 2) {
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 1) {
        *puVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusObjectPath>::metaType;
        goto LAB_00644547;
      }
    }
    else {
      puVar3 = (undefined8 *)*_a;
    }
    *puVar3 = 0;
    goto LAB_00644547;
  }
  if (_c != InvokeMetaMethod) goto LAB_00644547;
  switch(_id) {
  case 0:
    local_90 = (QDBusPendingReplyBase)&DAT_aaaaaaaaaaaaaaaa;
    GetMenuForWindow((QDBusPendingReply<QString,_QDBusObjectPath> *)&local_90,
                     (QDBusMenuRegistrarInterface *)_o,*_a[1]);
    pQVar2 = (QDBusPendingCall *)*_a;
    if ((pQVar2 != (QDBusPendingCall *)0x0) &&
       (QDBusPendingReplyBase::assign(pQVar2), *(long *)pQVar2 != 0)) {
      local_88 = (QDBusPendingReplyBase)&QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
      pIStack_80 = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusObjectPath>::metaType;
      QDBusPendingReplyBase::setMetaTypes((int)pQVar2,(QMetaType *)0x2);
    }
    this_00 = &local_90;
    goto LAB_00644515;
  case 1:
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_40 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_60 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = (QDBusPendingReplyBase)&DAT_aaaaaaaaaaaaaaaa;
    pIStack_80 = (InterfaceType *)&DAT_aaaaaaaaaaaaaaaa;
    GetMenuForWindow((QDBusReply<QString> *)&local_88,(QDBusMenuRegistrarInterface *)_o,*_a[1],
                     (QDBusObjectPath *)_a[2]);
    this = (QDBusError *)*_a;
    if (this != (QDBusError *)0x0) {
      QDBusError::operator=(this,(QDBusError *)&local_88);
      QString::operator=((QString *)(this + 1),(QString *)&local_48);
    }
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,0x10);
      }
    }
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68,2,0x10);
      }
    }
    if (pIStack_80 != (InterfaceType *)0x0) {
      LOCK();
      *(int *)&pIStack_80->revision = *(int *)&pIStack_80->revision + -1;
      iVar1._0_2_ = pIStack_80->revision;
      iVar1._2_2_ = pIStack_80->alignment;
      UNLOCK();
      if (iVar1 == 0) {
        QArrayData::deallocate((QArrayData *)pIStack_80,2,0x10);
      }
    }
    goto LAB_00644547;
  case 2:
    local_88 = (QDBusPendingReplyBase)&DAT_aaaaaaaaaaaaaaaa;
    RegisterWindow((QDBusPendingReply<> *)&local_88,(QDBusMenuRegistrarInterface *)_o,*_a[1],
                   (QDBusObjectPath *)_a[2]);
    break;
  case 3:
    local_88 = (QDBusPendingReplyBase)&DAT_aaaaaaaaaaaaaaaa;
    UnregisterWindow((QDBusPendingReply<> *)&local_88,(QDBusMenuRegistrarInterface *)_o,*_a[1]);
    break;
  default:
    goto LAB_00644547;
  }
  pQVar2 = (QDBusPendingCall *)*_a;
  if ((pQVar2 != (QDBusPendingCall *)0x0) &&
     (QDBusPendingReplyBase::assign(pQVar2), *(long *)pQVar2 != 0)) {
    QDBusPendingReplyBase::setMetaTypes((int)pQVar2,(QMetaType *)0x0);
  }
  this_00 = &local_88;
LAB_00644515:
  QDBusPendingReplyBase::~QDBusPendingReplyBase(this_00);
LAB_00644547:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusMenuRegistrarInterface::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDBusMenuRegistrarInterface *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: { QDBusPendingReply<QString,QDBusObjectPath> _r = _t->GetMenuForWindow((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<QString,QDBusObjectPath>*>(_a[0]) = std::move(_r); }  break;
        case 1: { QDBusReply<QString> _r = _t->GetMenuForWindow((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QDBusObjectPath&>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QDBusReply<QString>*>(_a[0]) = std::move(_r); }  break;
        case 2: { QDBusPendingReply<> _r = _t->RegisterWindow((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QDBusObjectPath>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<>*>(_a[0]) = std::move(_r); }  break;
        case 3: { QDBusPendingReply<> _r = _t->UnregisterWindow((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<>*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusObjectPath >(); break;
            }
            break;
        }
    }
}